

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O2

bool __thiscall S2LatLngRect::Contains(S2LatLngRect *this,S2LatLng *ll)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined4 in_EAX;
  int iVar3;
  ostream *os;
  VType VVar4;
  S2LogMessage SStack_28;
  
  VVar4 = (ll->coords_).c_[0];
  auVar1._8_8_ = -(ulong)(ABS((ll->coords_).c_[1]) <= 3.141592653589793);
  auVar1._0_8_ = -(ulong)(ABS(VVar4) <= 1.5707963267948966);
  iVar3 = movmskpd(in_EAX,auVar1);
  if (iVar3 != 3) {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x8f,kError,(ostream *)&std::cerr);
    os = std::operator<<(SStack_28.stream_,"Invalid S2LatLng in S2LatLngRect::Contains: ");
    ::operator<<(os,ll);
    S2LogMessage::~S2LogMessage(&SStack_28);
    VVar4 = (ll->coords_).c_[0];
  }
  bVar2 = false;
  if (((this->lat_).bounds_.c_[0] <= VVar4) && (bVar2 = false, VVar4 <= (this->lat_).bounds_.c_[1]))
  {
    bVar2 = S1Interval::Contains(&this->lng_,(ll->coords_).c_[1]);
  }
  return bVar2;
}

Assistant:

bool S2LatLngRect::Contains(const S2LatLng& ll) const {
  S2_DLOG_IF(ERROR, !ll.is_valid())
      << "Invalid S2LatLng in S2LatLngRect::Contains: " << ll;

  return (lat_.Contains(ll.lat().radians()) &&
          lng_.Contains(ll.lng().radians()));
}